

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O0

Gia_Obj_t * Cbs_ManDecideHighest(Cbs_Man_t *p)

{
  bool bVar1;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObjMax;
  Gia_Obj_t *pObj;
  Cbs_Man_t *p_local;
  
  pGStack_20 = (Gia_Obj_t *)0x0;
  local_24 = (p->pJust).iHead;
  while( true ) {
    bVar1 = false;
    if (local_24 < (p->pJust).iTail) {
      pObjMax = (p->pJust).pData[local_24];
      bVar1 = pObjMax != (Gia_Obj_t *)0x0;
    }
    if (!bVar1) break;
    if ((pGStack_20 == (Gia_Obj_t *)0x0) || (pGStack_20 < pObjMax)) {
      pGStack_20 = pObjMax;
    }
    local_24 = local_24 + 1;
  }
  return pGStack_20;
}

Assistant:

static inline Gia_Obj_t * Cbs_ManDecideHighest( Cbs_Man_t * p )
{
    Gia_Obj_t * pObj, * pObjMax = NULL;
    int i;
    Cbs_QueForEachEntry( p->pJust, pObj, i )
        if ( pObjMax == NULL || pObjMax < pObj )
            pObjMax = pObj;
    return pObjMax;
}